

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVT.cpp
# Opt level: O3

void __thiscall OpenMD::NVT::doUpdateSizes(NVT *this)

{
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->oldVel_,
             (ulong)(uint)((this->super_VelocityVerletIntegrator).super_Integrator.info_)->
                          nIntegrableObjects_);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::resize
            (&this->oldJi_,
             (ulong)(uint)((this->super_VelocityVerletIntegrator).super_Integrator.info_)->
                          nIntegrableObjects_);
  return;
}

Assistant:

void NVT::doUpdateSizes() {
    oldVel_.resize(info_->getNIntegrableObjects());
    oldJi_.resize(info_->getNIntegrableObjects());
  }